

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParseCoberturaCoverage.cxx
# Opt level: O0

bool __thiscall
cmParseCoberturaCoverage::ReadCoverageXML(cmParseCoberturaCoverage *this,char *xmlFile)

{
  undefined1 local_90 [8];
  XMLParser parser;
  char *xmlFile_local;
  cmParseCoberturaCoverage *this_local;
  
  parser.CurFileName.field_2._8_8_ = xmlFile;
  XMLParser::XMLParser((XMLParser *)local_90,this->CTest,this->Coverage);
  cmXMLParser::ParseFile((cmXMLParser *)local_90,(char *)parser.CurFileName.field_2._8_8_);
  XMLParser::~XMLParser((XMLParser *)local_90);
  return true;
}

Assistant:

bool cmParseCoberturaCoverage::ReadCoverageXML(const char* xmlFile)
{
  cmParseCoberturaCoverage::XMLParser parser(this->CTest, this->Coverage);
  parser.ParseFile(xmlFile);
  return true;
}